

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall cmCTest::GetSubmitURL_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  allocator<char> local_159;
  cmAlphaNum local_158;
  char *local_128;
  size_t local_120;
  string password;
  string user;
  string method;
  cmAlphaNum local_a8;
  string location;
  string site;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"SubmitURL",(allocator<char> *)&local_a8);
  GetCTestConfiguration(__return_storage_ptr__,this,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"DropMethod",(allocator<char> *)&local_a8);
    GetCTestConfiguration(&method,this,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"DropSiteUser",(allocator<char> *)&local_a8);
    GetCTestConfiguration(&user,this,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"DropSitePassword",(allocator<char> *)&local_a8);
    GetCTestConfiguration(&password,this,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"DropSite",(allocator<char> *)&local_a8);
    GetCTestConfiguration(&site,this,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"DropLocation",(allocator<char> *)&local_a8);
    GetCTestConfiguration(&location,this,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    if (method._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"http",&local_159);
    }
    else {
      std::__cxx11::string::string((string *)&local_128,(string *)&method);
    }
    local_158.View_._M_len = local_120;
    local_158.View_._M_str = local_128;
    local_a8.View_._M_len = 3;
    local_a8.View_._M_str = "://";
    cmStrCat<>(&local_38,&local_158,&local_a8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_128);
    if (user._M_string_length != 0) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      if (password._M_string_length != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::~string((string *)&site);
    std::__cxx11::string::~string((string *)&password);
    std::__cxx11::string::~string((string *)&user);
    std::__cxx11::string::~string((string *)&method);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetSubmitURL()
{
  std::string url = this->GetCTestConfiguration("SubmitURL");
  if (url.empty()) {
    std::string method = this->GetCTestConfiguration("DropMethod");
    std::string user = this->GetCTestConfiguration("DropSiteUser");
    std::string password = this->GetCTestConfiguration("DropSitePassword");
    std::string site = this->GetCTestConfiguration("DropSite");
    std::string location = this->GetCTestConfiguration("DropLocation");

    url = cmStrCat(method.empty() ? "http" : method, "://"_s);
    if (!user.empty()) {
      url += user;
      if (!password.empty()) {
        url += ':';
        url += password;
      }
      url += '@';
    }
    url += site;
    url += location;
  }
  return url;
}